

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cppcms_error_category.cpp
# Opt level: O2

string * __thiscall
cppcms::impl::error_category::message_abi_cxx11_
          (string *__return_storage_ptr__,error_category *this,int cat)

{
  allocator *paVar1;
  char *pcVar2;
  allocator local_b;
  allocator local_a;
  allocator local_9;
  
  if (cat == 1) {
    pcVar2 = "protocol violation";
    paVar1 = &local_a;
  }
  else if (cat == 0) {
    pcVar2 = "ok";
    paVar1 = &local_9;
  }
  else {
    pcVar2 = "unknown";
    paVar1 = &local_b;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string error_category::message(int cat) const
	{
		switch(cat) {
		case errc::ok: return "ok";
		case errc::protocol_violation: return "protocol violation";
		default:
			return "unknown";
		}
	}